

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlebsdf.cpp
# Opt level: O3

Color __thiscall SingleBSDF::f(SingleBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  BxDF *pBVar9;
  Image *this_00;
  undefined1 auVar10 [16];
  undefined4 extraout_EAX;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  undefined8 extraout_XMM0_Qa;
  float fVar15;
  Color CVar16;
  vec3f wiL;
  vec3f woL;
  vec3f N2;
  vec3f N1;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  Color local_60;
  vec3f local_50;
  vec3f local_40;
  
  if (this->component != (BxDF *)0x0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    BSDF::getLocalBasis(&(hit->super_Hit).Ns,&local_40,&local_50);
    fVar15 = wo->x;
    fVar1 = wo->y;
    fVar2 = wo->z;
    fVar3 = (hit->super_Hit).Ns.x;
    fVar4 = (hit->super_Hit).Ns.y;
    fVar5 = (hit->super_Hit).Ns.z;
    local_68 = fVar2 * fVar5 + fVar15 * fVar3 + fVar1 * fVar4;
    local_70 = CONCAT44(fVar2 * local_50.z + fVar15 * local_50.x + fVar1 * local_50.y,
                        fVar2 * local_40.z + fVar15 * local_40.x + fVar1 * local_40.y);
    fVar6 = wi->x;
    fVar7 = wi->y;
    fVar8 = wi->z;
    local_78 = fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7;
    local_80 = CONCAT44(fVar8 * local_50.z + fVar6 * local_50.x + fVar7 * local_50.y,
                        fVar8 * local_40.z + fVar6 * local_40.x + fVar7 * local_40.y);
    fVar3 = (hit->super_Hit).Ng.x;
    fVar4 = (hit->super_Hit).Ng.y;
    fVar5 = (hit->super_Hit).Ng.z;
    uVar14 = 0;
    iVar12 = -(uint)(0.0 < fVar5 * fVar2 + fVar3 * fVar15 + fVar4 * fVar1);
    iVar13 = -(uint)(0.0 < fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7);
    auVar10._4_4_ = iVar12;
    auVar10._0_4_ = iVar12;
    auVar10._8_4_ = iVar13;
    auVar10._12_4_ = iVar13;
    uVar11 = movmskpd(extraout_EAX,auVar10);
    pBVar9 = this->component;
    if ((pBVar9->flags & (uint)((POPCOUNT((char)uVar11) & 1U) != 0) * 2 + REFLECT) == 0) {
      fVar15 = 0.0;
    }
    else {
      this_00 = (this->super_BSDF).albedoTexture;
      if (this_00 == (Image *)0x0) {
        local_60 = (this->super_BSDF).albedoConst;
      }
      else {
        local_60._0_8_ = (ulong)(hit->super_Hit).uv ^ 0x8000000000000000;
        local_60 = Image::sample(this_00,(vec2f *)&local_60);
      }
      fVar15 = local_60.z;
      (**pBVar9->_vptr_BxDF)(pBVar9,&local_60,&local_70,&local_80);
      uVar14 = extraout_XMM0_Qa;
    }
    CVar16.z = fVar15;
    CVar16.x = (float)(int)uVar14;
    CVar16.y = (float)(int)((ulong)uVar14 >> 0x20);
    return CVar16;
  }
  return (Color)ZEXT412(0);
}

Assistant:

Color SingleBSDF::f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
{
	if (component == NULL) return Color(0);
	vec3f N1,N2;
	getLocalBasis(hit.Ns, N1, N2);
	// transform wo, wi to local surface Ns' = (0,0,1)
	vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
	vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
	// use Ng to determine whether BRDF or BTDF is used
	bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
	BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
	return (component->flags & allowed)? component->f(albedo(hit.uv), woL, wiL): 0;
}